

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMathCommand.cxx
# Opt level: O0

bool anon_unknown.dwarf_9aa4a5::HandleExprCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  string *__format;
  cmExecutionStatus *pcVar1;
  bool bVar2;
  int iVar3;
  size_type sVar4;
  const_reference name;
  cmMakefile *pcVar5;
  const_reference __lhs;
  char *pcVar6;
  int64_t iVar7;
  ulong uVar8;
  string_view local_718;
  string *local_708;
  string *w;
  char *fmt;
  char buffer [1024];
  allocator<char> local_2e9;
  string local_2e8;
  undefined1 local_2c8 [8];
  cmExprParserHelper helper;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  undefined1 local_1e8 [8];
  string error_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  undefined1 local_188 [8];
  string error_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  undefined1 local_e0 [8];
  string error;
  string *argument;
  string *option;
  undefined1 local_a8 [8];
  string messageHint;
  int local_74;
  NumericFormat outputFormat;
  size_t argumentIndex;
  string *expression;
  string *outputVariable;
  allocator<char> local_41;
  string local_40;
  cmExecutionStatus *local_20;
  cmExecutionStatus *status_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  local_20 = status;
  status_local = (cmExecutionStatus *)args;
  sVar4 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  if ((sVar4 != 3) &&
     (sVar4 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)status_local), pcVar1 = local_20, sVar4 != 5)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"EXPR called with incorrect arguments.",&local_41);
    cmExecutionStatus::SetError(pcVar1,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    args_local._7_1_ = 0;
    goto LAB_0056ec8d;
  }
  name = std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)status_local,1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)status_local,2);
  local_74 = 0;
  pcVar5 = cmExecutionStatus::GetMakefile(local_20);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)((long)&messageHint.field_2 + 8),
             "ERROR");
  cmMakefile::AddDefinition(pcVar5,name,stack0xffffffffffffff78);
  sVar4 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)status_local);
  if (3 < sVar4) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_a8,"sub-command EXPR ",(allocator<char> *)((long)&option + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&option + 7));
    __lhs = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)status_local,3);
    bVar2 = std::operator==(__lhs,"OUTPUT_FORMAT");
    if (bVar2) {
      sVar4 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)status_local);
      if (sVar4 < 5) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&error_2.field_2 + 8),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8
                       ,"missing argument for option \"");
        std::operator+(&local_1a8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&error_2.field_2 + 8),__lhs);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_188,&local_1a8,"\".");
        std::__cxx11::string::~string((string *)&local_1a8);
        std::__cxx11::string::~string((string *)(error_2.field_2._M_local_buf + 8));
        cmExecutionStatus::SetError(local_20,(string *)local_188);
        args_local._7_1_ = 0;
        error_1.field_2._12_4_ = 1;
        std::__cxx11::string::~string((string *)local_188);
      }
      else {
        error.field_2._8_8_ =
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)status_local,4);
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )error.field_2._8_8_,"DECIMAL");
        if (bVar2) {
          local_74 = 1;
        }
        else {
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)error.field_2._8_8_,"HEXADECIMAL");
          if (!bVar2) {
            std::operator+(&local_160,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_a8,"value \"");
            std::operator+(&local_140,&local_160,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           error.field_2._8_8_);
            std::operator+(&local_120,&local_140,"\" for option \"");
            std::operator+(&local_100,&local_120,__lhs);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_e0,&local_100,"\" is invalid.");
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::~string((string *)&local_140);
            std::__cxx11::string::~string((string *)&local_160);
            cmExecutionStatus::SetError(local_20,(string *)local_e0);
            args_local._7_1_ = 0;
            error_1.field_2._12_4_ = 1;
            std::__cxx11::string::~string((string *)local_e0);
            goto LAB_0056e9cb;
          }
          local_74 = 2;
        }
        error_1.field_2._12_4_ = 0;
      }
    }
    else {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&helper.WarningString.field_2 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8,
                     "option \"");
      std::operator+(&local_208,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&helper.WarningString.field_2 + 8),__lhs);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8,
                     &local_208,"\" is unknown.");
      std::__cxx11::string::~string((string *)&local_208);
      std::__cxx11::string::~string((string *)(helper.WarningString.field_2._M_local_buf + 8));
      cmExecutionStatus::SetError(local_20,(string *)local_1e8);
      args_local._7_1_ = 0;
      error_1.field_2._12_4_ = 1;
      std::__cxx11::string::~string((string *)local_1e8);
    }
LAB_0056e9cb:
    std::__cxx11::string::~string((string *)local_a8);
    if (error_1.field_2._12_4_ != 0) goto LAB_0056ec8d;
  }
  if (local_74 == 0) {
    local_74 = 1;
  }
  cmExprParserHelper::cmExprParserHelper((cmExprParserHelper *)local_2c8);
  pcVar6 = (char *)std::__cxx11::string::c_str();
  iVar3 = cmExprParserHelper::ParseString((cmExprParserHelper *)local_2c8,pcVar6,0);
  pcVar1 = local_20;
  if (iVar3 == 0) {
    pcVar6 = cmExprParserHelper::GetError((cmExprParserHelper *)local_2c8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2e8,pcVar6,&local_2e9);
    cmExecutionStatus::SetError(pcVar1,&local_2e8);
    std::__cxx11::string::~string((string *)&local_2e8);
    std::allocator<char>::~allocator(&local_2e9);
    args_local._7_1_ = 0;
  }
  else {
    if ((local_74 == 1) || (local_74 != 2)) {
      w = (string *)0xca55ed;
    }
    else {
      w = (string *)0xcbed6c;
    }
    __format = w;
    iVar7 = cmExprParserHelper::GetResult((cmExprParserHelper *)local_2c8);
    snprintf((char *)&fmt,0x400,(char *)__format,iVar7);
    local_708 = cmExprParserHelper::GetWarning_abi_cxx11_((cmExprParserHelper *)local_2c8);
    uVar8 = std::__cxx11::string::empty();
    if ((uVar8 & 1) == 0) {
      pcVar5 = cmExecutionStatus::GetMakefile(local_20);
      cmMakefile::IssueMessage(pcVar5,AUTHOR_WARNING,local_708);
    }
    pcVar5 = cmExecutionStatus::GetMakefile(local_20);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_718,(char *)&fmt);
    cmMakefile::AddDefinition(pcVar5,name,local_718);
    args_local._7_1_ = 1;
  }
  error_1.field_2._12_4_ = 1;
  cmExprParserHelper::~cmExprParserHelper((cmExprParserHelper *)local_2c8);
LAB_0056ec8d:
  return (bool)(args_local._7_1_ & 1);
}

Assistant:

bool HandleExprCommand(std::vector<std::string> const& args,
                       cmExecutionStatus& status)
{
  if ((args.size() != 3) && (args.size() != 5)) {
    status.SetError("EXPR called with incorrect arguments.");
    return false;
  }

  enum class NumericFormat
  {
    UNINITIALIZED,
    DECIMAL,
    HEXADECIMAL,
  };

  const std::string& outputVariable = args[1];
  const std::string& expression = args[2];
  size_t argumentIndex = 3;
  NumericFormat outputFormat = NumericFormat::UNINITIALIZED;

  status.GetMakefile().AddDefinition(outputVariable, "ERROR");

  if (argumentIndex < args.size()) {
    const std::string messageHint = "sub-command EXPR ";
    std::string const& option = args[argumentIndex++];
    if (option == "OUTPUT_FORMAT") {
      if (argumentIndex < args.size()) {
        std::string const& argument = args[argumentIndex++];
        if (argument == "DECIMAL") {
          outputFormat = NumericFormat::DECIMAL;
        } else if (argument == "HEXADECIMAL") {
          outputFormat = NumericFormat::HEXADECIMAL;
        } else {
          std::string error = messageHint + "value \"" + argument +
            "\" for option \"" + option + "\" is invalid.";
          status.SetError(error);
          return false;
        }
      } else {
        std::string error =
          messageHint + "missing argument for option \"" + option + "\".";
        status.SetError(error);
        return false;
      }
    } else {
      std::string error =
        messageHint + "option \"" + option + "\" is unknown.";
      status.SetError(error);
      return false;
    }
  }

  if (outputFormat == NumericFormat::UNINITIALIZED) {
    outputFormat = NumericFormat::DECIMAL;
  }

  cmExprParserHelper helper;
  if (!helper.ParseString(expression.c_str(), 0)) {
    status.SetError(helper.GetError());
    return false;
  }

  char buffer[1024];
  const char* fmt;
  switch (outputFormat) {
    case NumericFormat::HEXADECIMAL:
      fmt = "0x%" KWIML_INT_PRIx64;
      break;
    case NumericFormat::DECIMAL:
      CM_FALLTHROUGH;
    default:
      fmt = "%" KWIML_INT_PRId64;
      break;
  }
  snprintf(buffer, sizeof(buffer), fmt, helper.GetResult());

  std::string const& w = helper.GetWarning();
  if (!w.empty()) {
    status.GetMakefile().IssueMessage(MessageType::AUTHOR_WARNING, w);
  }

  status.GetMakefile().AddDefinition(outputVariable, buffer);
  return true;
}